

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O0

curl_mimepart * curl_mime_addpart(curl_mime *mime)

{
  curl_mimepart *part;
  curl_mime *mime_local;
  
  if (mime == (curl_mime *)0x0) {
    mime_local = (curl_mime *)0x0;
  }
  else {
    mime_local = (curl_mime *)(*Curl_cmalloc)(0x1c0);
    if ((curl_mimepart *)mime_local != (curl_mimepart *)0x0) {
      Curl_mime_initpart((curl_mimepart *)mime_local,mime->easy);
      ((curl_mimepart *)mime_local)->parent = mime;
      if (mime->lastpart == (curl_mimepart *)0x0) {
        mime->firstpart = (curl_mimepart *)mime_local;
      }
      else {
        mime->lastpart->nextpart = (curl_mimepart *)mime_local;
      }
      mime->lastpart = (curl_mimepart *)mime_local;
    }
  }
  return (curl_mimepart *)mime_local;
}

Assistant:

curl_mimepart *curl_mime_addpart(curl_mime *mime)
{
  curl_mimepart *part;

  if(!mime)
    return NULL;

  part = (curl_mimepart *) malloc(sizeof *part);

  if(part) {
    Curl_mime_initpart(part, mime->easy);
    part->parent = mime;

    if(mime->lastpart)
      mime->lastpart->nextpart = part;
    else
      mime->firstpart = part;

    mime->lastpart = part;
  }

  return part;
}